

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::objectivec::BuildFlagsString
                   (FlagType flag_type,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *strings)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  string *in_RDI;
  size_t i;
  string *string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  size_type local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [39];
  undefined1 local_19;
  string *psVar3;
  
  __lhs = in_RDI;
  psVar3 = in_RDI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar1 == 0) {
    (anonymous_namespace)::GetZeroEnumNameForFlagType_abi_cxx11_((FlagType)((ulong)psVar3 >> 0x20));
  }
  else {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDX);
    if (sVar1 == 1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_RDX,0);
      std::__cxx11::string::string((string *)__lhs,(string *)pvVar2);
    }
    else {
      local_19 = 0;
      __rhs = &local_60;
      (anonymous_namespace)::GetEnumNameForFlagType_abi_cxx11_((FlagType)((ulong)in_RDX >> 0x20));
      std::operator+((char *)__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string((string *)&local_60);
      for (local_78 = 0;
          sVar1 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(in_RDX), local_78 != sVar1; local_78 = local_78 + 1) {
        if (local_78 != 0) {
          std::__cxx11::string::append((char *)__lhs);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDX,local_78);
        std::__cxx11::string::append((string *)__lhs);
      }
      std::__cxx11::string::append((char *)__lhs);
    }
  }
  return in_RDI;
}

Assistant:

string BuildFlagsString(const FlagType flag_type,
                        const std::vector<string>& strings) {
  if (strings.size() == 0) {
    return GetZeroEnumNameForFlagType(flag_type);
  } else if (strings.size() == 1) {
    return strings[0];
  }
  string string("(" + GetEnumNameForFlagType(flag_type) + ")(");
  for (size_t i = 0; i != strings.size(); ++i) {
    if (i > 0) {
      string.append(" | ");
    }
    string.append(strings[i]);
  }
  string.append(")");
  return string;
}